

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomModel.pb.cc
# Opt level: O3

char * __thiscall
CoreML::Specification::CustomModel::_InternalParse(CustomModel *this,char *ptr,ParseContext *ctx)

{
  InternalMetadata *this_00;
  byte bVar1;
  internal *this_01;
  size_t size;
  bool bVar2;
  string *s;
  uint uVar3;
  undefined8 *puVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  byte *pbVar5;
  ArenaStringPtr *pAVar6;
  char cVar7;
  uint res;
  pair<const_char_*,_unsigned_int> pVar8;
  StringPiece str;
  byte *local_40;
  ArenaStringPtr *local_38;
  char *field_name;
  
  local_40 = (byte *)ptr;
  bVar2 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                    (&ctx->super_EpsCopyInputStream,(char **)&local_40,ctx->group_depth_);
  if (!bVar2) {
    this_00 = &(this->super_MessageLite)._internal_metadata_;
    local_38 = &this->description_;
    do {
      bVar1 = *local_40;
      res = (uint)bVar1;
      pbVar5 = local_40 + 1;
      if ((char)bVar1 < '\0') {
        res = ((uint)bVar1 + (uint)*pbVar5 * 0x80) - 0x80;
        if ((char)*pbVar5 < '\0') {
          pVar8 = google::protobuf::internal::ReadTagFallback((char *)local_40,res);
          pbVar5 = (byte *)pVar8.first;
          res = pVar8.second;
        }
        else {
          pbVar5 = local_40 + 2;
        }
      }
      uVar3 = res >> 3;
      field_name = (char *)(ulong)uVar3;
      cVar7 = (char)res;
      local_40 = pbVar5;
      if (uVar3 == 0x28) {
        if (cVar7 != 'B') goto LAB_0031fdb0;
        puVar4 = (undefined8 *)(this_00->ptr_ & 0xfffffffffffffffc);
        pAVar6 = local_38;
        if ((this_00->ptr_ & 1U) != 0) {
          puVar4 = (undefined8 *)*puVar4;
        }
LAB_0031fd5f:
        s = google::protobuf::internal::ArenaStringPtr::Mutable_abi_cxx11_(pAVar6,puVar4);
        local_40 = (byte *)google::protobuf::internal::InlineGreedyStringParser
                                     (s,(char *)local_40,ctx);
        this_01 = (internal *)(s->_M_dataplus)._M_p;
        size = s->_M_string_length;
        if ((long)size < 0) {
          google::protobuf::stringpiece_internal::StringPiece::LogFatalSizeTooBig
                    (size,"string length exceeds max size");
        }
        str.length_ = 0;
        str.ptr_ = (char *)size;
        bVar2 = google::protobuf::internal::VerifyUTF8(this_01,str,field_name);
        if (!bVar2) {
          return (char *)0x0;
        }
joined_r0x0031fda9:
        if (local_40 == (byte *)0x0) {
          return (char *)0x0;
        }
      }
      else {
        if (uVar3 != 0x1e) {
          if ((uVar3 == 10) && (cVar7 == 'R')) {
            puVar4 = (undefined8 *)(this_00->ptr_ & 0xfffffffffffffffc);
            pAVar6 = &this->classname_;
            if ((this_00->ptr_ & 1U) != 0) {
              puVar4 = (undefined8 *)*puVar4;
            }
            goto LAB_0031fd5f;
          }
LAB_0031fdb0:
          if ((res == 0) || ((res & 7) == 4)) {
            if (pbVar5 == (byte *)0x0) {
              return (char *)0x0;
            }
            (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = res - 1;
            return (char *)pbVar5;
          }
          if ((this_00->ptr_ & 1U) == 0) {
            unknown = google::protobuf::internal::InternalMetadata::
                      mutable_unknown_fields_slow<std::__cxx11::string>(this_00);
          }
          else {
            unknown = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((this_00->ptr_ & 0xfffffffffffffffcU) + 8);
          }
          local_40 = (byte *)google::protobuf::internal::UnknownFieldParse
                                       (res,unknown,(char *)local_40,ctx);
          goto joined_r0x0031fda9;
        }
        if (cVar7 != -0xe) goto LAB_0031fdb0;
        local_40 = pbVar5 + -2;
        do {
          local_40 = local_40 + 2;
          local_40 = (byte *)google::protobuf::internal::ParseContext::
                             ParseMessage<google::protobuf::internal::MapFieldLite<CoreML::Specification::CustomModel_ParametersEntry_DoNotUse,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>,_true>
                                       (ctx,&this->parameters_,(char *)local_40);
          if (local_40 == (byte *)0x0) {
            return (char *)0x0;
          }
        } while ((local_40 < (ctx->super_EpsCopyInputStream).limit_end_) &&
                (*(short *)local_40 == 0x1f2));
      }
      bVar2 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                        (&ctx->super_EpsCopyInputStream,(char **)&local_40,ctx->group_depth_);
    } while (!bVar2);
  }
  return (char *)local_40;
}

Assistant:

const char* CustomModel::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // string className = 10;
      case 10:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 82)) {
          auto str = _internal_mutable_classname();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // map<string, .CoreML.Specification.CustomModel.CustomModelParamValue> parameters = 30;
      case 30:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 242)) {
          ptr -= 2;
          do {
            ptr += 2;
            ptr = ctx->ParseMessage(&parameters_, ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<242>(ptr));
        } else
          goto handle_unusual;
        continue;
      // string description = 40;
      case 40:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 66)) {
          auto str = _internal_mutable_description();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}